

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avilib.cpp
# Opt level: O1

bool avilib::cancel(int32_t nom,int32_t denom,int32_t *out_nom,int32_t *out_denom)

{
  int32_t iVar1;
  bool bVar2;
  
  if (nom == 0 || denom == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = gcd(nom,denom);
    bVar2 = iVar1 != 0;
    if (bVar2) {
      *out_nom = nom / iVar1;
      *out_denom = denom / iVar1;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool avilib::cancel( int32_t nom, int32_t denom, int32_t &out_nom, int32_t &out_denom )
{
	if( !denom || !nom ) return false;
	int32_t _gcd = gcd( nom, denom );

	if( _gcd ) {
		out_nom = nom / _gcd;
		out_denom = denom / _gcd;
		return true;
	}

	return false;
}